

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sldperm.c
# Opt level: O3

int sldperm(int job,int n,int_t nnz,int_t *colptr,int_t *adjncy,float *nzval,int *perm,float *u,
           float *v)

{
  double *dw;
  ulong uVar1;
  ulong uVar2;
  long lVar3;
  int iVar4;
  undefined4 in_register_00000034;
  int_t ln;
  int_t ljob;
  int_t num;
  int_t nnz_local;
  double *local_188;
  ulong local_180;
  int_t ldw;
  int_t local_174;
  int_t *local_170;
  int_t info [10];
  int_t icntl [10];
  
  local_180 = CONCAT44(in_register_00000034,n);
  nnz_local = nnz;
  local_188 = (double *)superlu_malloc((long)nnz * 8);
  iVar4 = (int)local_180;
  local_174 = nnz + iVar4 * 10;
  if (job != 3) {
    local_174 = iVar4 * 5;
  }
  local_170 = intMalloc(local_174);
  if (local_170 == (int_t *)0x0) {
    sprintf((char *)icntl,"%s at line %d in file %s\n","Malloc fails for iw[]",0x6f,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sldperm.c");
    superlu_abort_and_exit((char *)icntl);
  }
  ldw = iVar4 * 3 + nnz;
  dw = (double *)superlu_malloc((long)ldw << 3);
  if (dw == (double *)0x0) {
    sprintf((char *)icntl,"%s at line %d in file %s\n","Malloc fails for dw[]",0x72,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/sldperm.c");
    superlu_abort_and_exit((char *)icntl);
  }
  if (-1 < iVar4) {
    uVar1 = 0;
    do {
      colptr[uVar1] = colptr[uVar1] + 1;
      uVar1 = uVar1 + 1;
    } while (iVar4 + 1 != uVar1);
  }
  if (nnz < 1) {
    mc64id_(icntl);
    ln = iVar4;
  }
  else {
    uVar1 = 0;
    do {
      adjncy[uVar1] = adjncy[uVar1] + 1;
      uVar1 = uVar1 + 1;
    } while ((uint)nnz != uVar1);
    mc64id_(icntl);
    ln = (int_t)local_180;
    if (0 < nnz) {
      uVar1 = 0;
      do {
        local_188[uVar1] = (double)nzval[uVar1];
        uVar1 = uVar1 + 1;
      } while ((uint)nnz != uVar1);
    }
  }
  ljob = job;
  mc64ad_(&ljob,&ln,&nnz_local,colptr,adjncy,local_188,&num,perm,&local_174,local_170,&ldw,dw,icntl,
          info);
  uVar1 = local_180;
  iVar4 = (int)local_180;
  if (info[0] == 1) {
    printf(".. The last %d permutations:\n",(ulong)(uint)(iVar4 - num));
    slu_PrintInt10("perm",iVar4 - num,perm + num);
  }
  if (-1 < iVar4) {
    uVar2 = 0;
    do {
      colptr[uVar2] = colptr[uVar2] + -1;
      uVar2 = uVar2 + 1;
    } while (iVar4 + 1 != uVar2);
  }
  if (0 < (long)nnz_local) {
    lVar3 = 0;
    do {
      adjncy[lVar3] = adjncy[lVar3] + -1;
      lVar3 = lVar3 + 1;
    } while (nnz_local != lVar3);
  }
  if (0 < iVar4) {
    uVar1 = uVar1 & 0xffffffff;
    uVar2 = 0;
    do {
      perm[uVar2] = perm[uVar2] + -1;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
    if (job == 5 && 0 < iVar4) {
      uVar2 = 0;
      do {
        u[uVar2] = (float)dw[uVar2];
        v[uVar2] = (float)dw[uVar1 + uVar2];
        uVar2 = uVar2 + 1;
      } while (uVar1 != uVar2);
    }
  }
  superlu_free(local_170);
  superlu_free(dw);
  superlu_free(local_188);
  return info[0];
}

Assistant:

int
sldperm(int job, int n, int_t nnz, int_t colptr[], int_t adjncy[],
	float nzval[], int *perm, float u[], float v[])
{
    int_t i, num;
    int_t icntl[10], info[10];
    int_t liw, ldw, *iw;
    double *dw;
    double *nzval_d = (double *) SUPERLU_MALLOC(nnz * sizeof(double));

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Enter sldperm()");
#endif
    liw = 5*n;
    if ( job == 3 ) liw = 10*n + nnz;
    if ( !(iw = intMalloc(liw)) ) ABORT("Malloc fails for iw[]");
    ldw = 3*n + nnz;
    if ( !(dw = (double*) SUPERLU_MALLOC(ldw * sizeof(double))) )
          ABORT("Malloc fails for dw[]");
	    
    /* Increment one to get 1-based indexing. */
    for (i = 0; i <= n; ++i) ++colptr[i];
    for (i = 0; i < nnz; ++i) ++adjncy[i];
#if ( DEBUGlevel>=2 )
    printf("LDPERM(): n %d, nnz %lld\n", n, (long long) nnz);
    slu_PrintInt10("colptr", n+1, colptr);
    slu_PrintInt10("adjncy", nnz, adjncy);
#endif
	
    /* 
     * NOTE:
     * =====
     *
     * MC64AD assumes that column permutation vector is defined as:
     * perm(i) = j means column i of permuted A is in column j of original A.
     *
     * Since a symmetric permutation preserves the diagonal entries. Then
     * by the following relation:
     *     P'(A*P')P = P'A
     * we can apply inverse(perm) to rows of A to get large diagonal entries.
     * But, since 'perm' defined in MC64AD happens to be the reverse of
     * SuperLU's definition of permutation vector, therefore, it is already
     * an inverse for our purpose. We will thus use it directly.
     *
     */
    mc64id_(icntl);
#if 0
    /* Suppress error and warning messages. */
    icntl[0] = -1;
    icntl[1] = -1;
#endif

    int_t ljob = job, ln = n;
    
    for (i = 0; i < nnz; ++i) nzval_d[i] = nzval[i];
    mc64ad_(&ljob, &ln, &nnz, colptr, adjncy, nzval_d, &num, perm,
	    &liw, iw, &ldw, dw, icntl, info);

#if ( DEBUGlevel>=2 )
    slu_PrintInt10("perm", n, perm);
    printf(".. After MC64AD info %lld\tsize of matching %lld\n", (long long)info[0], (long long) num);
#endif
    if ( info[0] == 1 ) { /* Structurally singular */
        printf(".. The last %d permutations:\n", (int)(n-num));
	slu_PrintInt10("perm", n-num, &perm[num]);
    }

    /* Restore to 0-based indexing. */
    for (i = 0; i <= n; ++i) --colptr[i];
    for (i = 0; i < nnz; ++i) --adjncy[i];
    for (i = 0; i < n; ++i) --perm[i];

    if ( job == 5 )
        for (i = 0; i < n; ++i) {
	    u[i] = dw[i];
	    v[i] = dw[n+i];
	}

    SUPERLU_FREE(iw);
    SUPERLU_FREE(dw);
    SUPERLU_FREE(nzval_d);

#if ( DEBUGlevel>=1 )
    CHECK_MALLOC("Exit sldperm()");
#endif

    return info[0];
}